

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int generate_by_descriptor_multisig
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,int flag,
              uchar *script,size_t script_len,size_t *write_len)

{
  uchar *puVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  miniscript_node_t *pmVar5;
  void *__base;
  miniscript_node_t *pmVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint *puVar11;
  ulong uVar12;
  size_t child_write_len;
  size_t local_70;
  size_t local_68;
  uint32_t local_5c;
  ulong local_58;
  uchar *local_50;
  int local_44;
  miniscript_node_t *local_40;
  long local_38;
  
  local_68 = 0;
  pmVar6 = node->child;
  uVar12 = 0x208;
  if (script_len < 0x208) {
    uVar12 = script_len;
  }
  iVar4 = -2;
  if ((pmVar6 != (miniscript_node_t *)0x0) &&
     (((parent == (miniscript_node_t *)0x0 || (parent->info != (miniscript_item_t *)0x0)) &&
      (local_5c = derive_child_num,
      iVar4 = generate_script_from_miniscript
                        (pmVar6,node,derive_child_num,script,script_len,&local_70), iVar4 == 0)))) {
    pmVar5 = pmVar6->next;
    if (pmVar5 == (miniscript_node_t *)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        uVar9 = uVar9 + 1;
        pmVar5 = pmVar5->next;
      } while (pmVar5 != (miniscript_node_t *)0x0);
    }
    local_58 = (ulong)uVar9;
    local_44 = flag;
    local_40 = parent;
    __base = wally_malloc(local_58 * 0x50);
    if (__base == (void *)0x0) {
      iVar4 = -3;
    }
    else {
      pmVar6 = pmVar6->next;
      if (pmVar6 != (miniscript_node_t *)0x0) {
        uVar7 = 0;
        do {
          *(miniscript_node_t **)((long)__base + (ulong)uVar7 * 0x50) = pmVar6;
          uVar7 = uVar7 + 1;
          pmVar6 = pmVar6->next;
        } while (pmVar6 != (miniscript_node_t *)0x0);
      }
      local_50 = script;
      if (uVar9 != 0) {
        local_38 = (long)__base + 8;
        lVar3 = local_58 * 0x50;
        lVar10 = 0;
        do {
          local_68 = 0;
          iVar4 = generate_script_from_miniscript
                            (*(miniscript_node_t **)((long)__base + lVar10),node,local_5c,
                             (uchar *)(local_38 + lVar10),0x41,&local_68);
          if (iVar4 != 0) goto LAB_0016a75e;
          *(undefined4 *)((long)__base + lVar10 + 0x4c) = (undefined4)local_68;
          lVar10 = lVar10 + 0x50;
        } while (lVar3 != lVar10);
      }
      if (local_44 == 8) {
        qsort(__base,local_58,0x50,compare_multisig_node);
      }
      if (uVar9 != 0) {
        puVar11 = (uint *)((long)__base + 0x4c);
        do {
          sVar2 = local_70;
          if (uVar12 < *puVar11 + local_70 + 1) goto LAB_0016a75e;
          puVar1 = local_50 + local_70;
          memcpy(puVar1 + 1,puVar11 + -0x11,(ulong)*puVar11);
          *puVar1 = (uchar)*puVar11;
          local_70 = sVar2 + (*puVar11 + 1);
          puVar11 = puVar11 + 0x14;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      iVar4 = generate_script_from_number
                        (local_58,local_40,local_50 + local_70,uVar12 - local_70,&local_68);
      if (iVar4 == 0) {
        sVar2 = local_70 + local_68;
        uVar8 = local_68 + local_70 + 1;
        local_70 = sVar2;
        if (uVar8 <= uVar12) {
          local_50[sVar2] = 0xae;
          *write_len = uVar8;
        }
      }
LAB_0016a75e:
      wally_free(__base);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int generate_by_descriptor_multisig(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    int flag,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t child_write_len = 0;
    size_t offset;
    uint32_t count = 0;
    uint32_t index = 0;
    struct miniscript_node_t *child = node->child;
    struct miniscript_node_t *temp_node;
    struct multisig_sort_data_t *sorted_node_array;
    size_t check_len = (DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE > script_len) ? script_len : DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE;

    if (!child || (parent && !parent->info))
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(child, node, derive_child_num, script, script_len, &offset);
    if (ret != WALLY_OK)
        return ret;

    temp_node = child->next;
    while (temp_node != NULL) {
        ++count;
        temp_node = temp_node->next;
    }

    sorted_node_array = (struct multisig_sort_data_t *)wally_malloc(
        count * sizeof(struct multisig_sort_data_t));
    if (!sorted_node_array)
        return WALLY_ENOMEM;

    temp_node = child->next;
    while (temp_node != NULL) {
        sorted_node_array[index].node = temp_node;
        ++index;
        temp_node = temp_node->next;
    }

    if (ret == WALLY_OK) {
        for (index = 0; index < count; ++index) {
            child_write_len = 0;
            ret = generate_script_from_miniscript(
                sorted_node_array[index].node, node, derive_child_num,
                sorted_node_array[index].script,
                sizeof(sorted_node_array[index].script),
                &child_write_len);
            if (ret != WALLY_OK)
                break;
            sorted_node_array[index].script_size = (uint32_t)child_write_len;
        }
    }
    if (ret == WALLY_OK) {
        if (flag == WALLY_SCRIPT_MULTISIG_SORTED) {
            qsort(sorted_node_array, count, sizeof(struct multisig_sort_data_t),
                  compare_multisig_node);
        }
        for (index = 0; index < count; ++index) {
            if (offset + sorted_node_array[index].script_size + 1 > check_len) {
                ret = WALLY_EINVAL;
                break;
            }

            memcpy(&script[offset + 1], sorted_node_array[index].script,
                   sorted_node_array[index].script_size);
            script[offset] = (unsigned char) sorted_node_array[index].script_size;
            offset += sorted_node_array[index].script_size + 1;
        }
    }

    if (ret == WALLY_OK) {
        ret = generate_script_from_number((int64_t)count, parent, &script[offset],
                                          check_len - offset, &child_write_len);
    }

    if (ret == WALLY_OK) {
        offset += child_write_len;
        if (offset + 1 > check_len) {
            ret = WALLY_EINVAL;
        } else {
            script[offset] = OP_CHECKMULTISIG;
            *write_len = offset + 1;
        }
    }
    wally_free(sorted_node_array);
    return WALLY_OK;
}